

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMathematics.cpp
# Opt level: O1

double chrono::ChSineStep(double x,double x1,double y1,double x2,double y2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 extraout_var [56];
  
  dVar4 = y1;
  if ((x1 < x) && (dVar4 = y2, x < x2)) {
    auVar2._0_8_ = sin(((x - x1) * 6.283185307179586) / (x2 - x1));
    auVar2._8_56_ = extraout_var;
    auVar3._0_8_ = (y2 - y1) / -6.283185307179586;
    auVar3._8_8_ = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = ((x - x1) * (y2 - y1)) / (x2 - x1) + y1;
    auVar1 = vfmadd213sd_fma(auVar2._0_16_,auVar3,auVar1);
    return auVar1._0_8_;
  }
  return dVar4;
}

Assistant:

double ChSineStep(double x, double x1, double y1, double x2, double y2) {
    if (x <= x1)
        return y1;
    if (x >= x2)
        return y2;
    double dx = x2 - x1;
    double dy = y2 - y1;
    double y = y1 + dy * (x - x1) / dx - (dy / CH_C_2PI) * std::sin(CH_C_2PI * (x - x1) / dx);
    return y;
}